

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O2

SAM_RG * sam_hdr_find_rg(SAM_hdr *hdr,char *rg)

{
  kh_m_s2i_t *h;
  khint_t kVar1;
  SAM_RG *pSVar2;
  
  h = hdr->rg_hash;
  kVar1 = kh_get_m_s2i(h,rg);
  if (kVar1 == h->n_buckets) {
    pSVar2 = (SAM_RG *)0x0;
  }
  else {
    pSVar2 = hdr->rg + h->vals[kVar1];
  }
  return pSVar2;
}

Assistant:

SAM_RG *sam_hdr_find_rg(SAM_hdr *hdr, const char *rg) {
    khint_t k = kh_get(m_s2i, hdr->rg_hash, rg);
    return k == kh_end(hdr->rg_hash)
	? NULL
	: &hdr->rg[kh_val(hdr->rg_hash, k)];
}